

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTIN.cpp
# Opt level: O1

string * __thiscall ZXing::GTIN::Price(string *__return_storage_ptr__,GTIN *this,string *ean5AddOn)

{
  long lVar1;
  long lVar2;
  long *__nptr;
  int iVar3;
  int *piVar4;
  long lVar5;
  ostream *poVar6;
  undefined8 uVar7;
  char *pcVar8;
  string currency;
  stringstream buf;
  char *local_1e0;
  long local_1d8;
  char local_1d0;
  undefined7 uStack_1cf;
  long *local_1c0;
  long *local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  if (*(long *)(this + 8) != 5) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_1e0 = &local_1d0;
  local_1d8 = 0;
  local_1d0 = '\0';
  switch(**(undefined1 **)this) {
  case 0x30:
  case 0x31:
    pcVar8 = anon_var_dwarf_50522;
    break;
  default:
    pcVar8 = "";
    break;
  case 0x33:
    pcVar8 = "AUD $";
    break;
  case 0x34:
    pcVar8 = "NZD $";
    break;
  case 0x35:
    pcVar8 = "USD $";
    break;
  case 0x36:
    pcVar8 = "CAD $";
    break;
  case 0x39:
    iVar3 = std::__cxx11::string::compare((char *)this);
    if (iVar3 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      goto LAB_00135c24;
    }
    iVar3 = std::__cxx11::string::compare((char *)this);
    if (iVar3 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"0.00","");
      goto LAB_00135c24;
    }
    iVar3 = std::__cxx11::string::compare((char *)this);
    if (iVar3 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Used","");
      goto LAB_00135c24;
    }
    std::__cxx11::string::operator=((string *)&local_1e0,"");
    goto LAB_00135b0f;
  }
  std::__cxx11::string::_M_replace((ulong)&local_1e0,0,(char *)0x0,(ulong)pcVar8);
LAB_00135b0f:
  std::__cxx11::string::substr((ulong)local_1b8,(ulong)this);
  __nptr = local_1b8[0];
  piVar4 = __errno_location();
  iVar3 = *piVar4;
  *piVar4 = 0;
  lVar5 = strtol((char *)__nptr,(char **)&local_1c0,10);
  if (local_1c0 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar5 == lVar5) && (*piVar4 != 0x22)) {
    if (*piVar4 == 0) {
      *piVar4 = iVar3;
    }
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0],local_1a8[0] + 1);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1e0,local_1d8);
    lVar1 = *(long *)poVar6;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xfffffefb | 4;
    *(undefined8 *)(poVar6 + *(long *)(lVar1 + -0x18) + 8) = 2;
    std::ostream::_M_insert<double>((double)((float)(int)lVar5 / 100.0));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
LAB_00135c24:
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
    }
    return __return_storage_ptr__;
  }
  uVar7 = std::__throw_out_of_range("stoi");
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

std::string Price(const std::string& ean5AddOn)
{
	if (ean5AddOn.size() != 5)
		return {};

	std::string currency;
	switch (ean5AddOn.front()) {
	case '0': [[fallthrough]];
	case '1': currency = "GBP £"; break; // UK
	case '3': currency = "AUD $"; break; // AUS
	case '4': currency = "NZD $"; break; // NZ
	case '5': currency = "USD $"; break; // US
	case '6': currency = "CAD $"; break; // CA
	case '9':
		// Reference: http://www.jollytech.com
		if (ean5AddOn == "90000") // No suggested retail price
			return {};
		if (ean5AddOn == "99991") // Complementary
			return "0.00";
		if (ean5AddOn == "99990")
			return "Used";

		// Otherwise... unknown currency?
		currency = "";
		break;
	default: currency = ""; break;
	}

	int rawAmount = std::stoi(ean5AddOn.substr(1));
	std::stringstream buf;
	buf << currency << std::fixed << std::setprecision(2) << (float(rawAmount) / 100);
	return buf.str();
}